

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupGetProperties
          (zet_metric_group_handle_t hMetricGroup,zet_metric_group_properties_t *pProperties)

{
  zet_pfnMetricGroupGetProperties_t pfnGetProperties;
  ze_result_t result;
  zet_metric_group_properties_t *pProperties_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnGetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c890 != (code *)0x0) {
    pfnGetProperties._4_4_ = (*DAT_0011c890)(hMetricGroup,pProperties);
  }
  return pfnGetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGetProperties(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_group_properties_t* pProperties      ///< [in,out] metric group properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zetDdiTable.MetricGroup.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hMetricGroup, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }